

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1.c
# Opt level: O2

void ptls_asn1_print_type
               (int type_class,uint32_t type_number,int level,ptls_minicrypto_log_ctx_t *log_ctx)

{
  void *pvVar1;
  _func_void_void_ptr_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  ulong uVar2;
  
  uVar2 = (ulong)type_number;
  ptls_asn1_print_indent(level,log_ctx);
  pvVar1 = log_ctx->ctx;
  UNRECOVERED_JUMPTABLE = log_ctx->fn;
  if (type_number < 0x1f && type_class == 0) {
    (*UNRECOVERED_JUMPTABLE)
              (pvVar1,"%s",asn1_universal_types_rel + *(int *)(asn1_universal_types_rel + uVar2 * 4)
              );
    return;
  }
  if (type_class == 2) {
    (*UNRECOVERED_JUMPTABLE)(pvVar1,"[%d]",uVar2);
    return;
  }
  (*UNRECOVERED_JUMPTABLE)
            (pvVar1,"%s[%d]",
             asn1_type_classes_rel + *(int *)(asn1_type_classes_rel + (long)type_class * 4),uVar2);
  return;
}

Assistant:

void ptls_asn1_print_type(int type_class, uint32_t type_number, int level, ptls_minicrypto_log_ctx_t *log_ctx)
{
    /* Print the type */
    ptls_asn1_print_indent(level, log_ctx);
    if (type_class == 0 && type_number < nb_asn1_universal_types) {
        log_ctx->fn(log_ctx->ctx, "%s", asn1_universal_types[type_number]);
    } else if (type_class == 2) {
        log_ctx->fn(log_ctx->ctx, "[%d]", type_number);
    } else {
        log_ctx->fn(log_ctx->ctx, "%s[%d]", asn1_type_classes[type_class], type_number);
    }
}